

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall
LinearScan::FillStackLiteralBailOutRecord
          (LinearScan *this,Instr *instr,BailOutInfo *bailOutInfo,FuncBailOutData *funcBailOutData,
          uint funcCount)

{
  uint *puVar1;
  uint uVar2;
  StackSym *pSVar3;
  long lVar4;
  StackLiteralBailOutInfo *pSVar5;
  BailOutRecord *pBVar6;
  code *pcVar7;
  bool bVar8;
  uint32 uVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  undefined4 *puVar12;
  Func *pFVar13;
  JITTimeFunctionBody *pJVar14;
  StackLiteralBailOutRecord *pSVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  
  uVar18 = bailOutInfo->stackLiteralBailOutInfoCount;
  if (uVar18 != 0) {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    lVar16 = 0;
    for (uVar17 = 0; uVar17 < uVar18; uVar17 = uVar17 + 1) {
      pSVar3 = *(StackSym **)((long)&bailOutInfo->stackLiteralBailOutInfo->stackSym + lVar16);
      uVar2 = *(uint *)((long)pSVar3->scratch + 0x78);
      uVar9 = IR::Instr::GetNumber(instr);
      if (uVar9 <= uVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7ea,
                           "(stackSym->scratch.linearScan.lifetime->start < instr->GetNumber())",
                           "stackSym->scratch.linearScan.lifetime->start < instr->GetNumber()");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      uVar2 = *(uint *)((long)pSVar3->scratch + 0x7c);
      uVar9 = IR::Instr::GetNumber(instr);
      if (uVar2 < uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7eb,
                           "(stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber())",
                           "stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber()");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      RVar10 = StackSym::GetByteCodeRegSlot(pSVar3);
      pFVar13 = StackSym::GetByteCodeFunc(pSVar3);
      uVar2 = pFVar13->inlineDepth;
      if (RVar10 == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f1,"(regSlot != Js::Constants::NoRegister)",
                           "regSlot != Js::Constants::NoRegister");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      pJVar14 = Func::GetJITFunctionBody(pFVar13);
      RVar11 = JITTimeFunctionBody::GetLocalsCount(pJVar14);
      if (RVar11 <= RVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f2,"(regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount())"
                           ,"regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount()");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      if (funcCount <= uVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f3,"(index < funcCount)","index < funcCount");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      if (funcBailOutData[uVar2].func != pFVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f4,"(funcBailOutData[index].func == stackSymFunc)",
                           "funcBailOutData[index].func == stackSymFunc");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      if (funcBailOutData[uVar2].localOffsets[RVar10] == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f5,"(funcBailOutData[index].localOffsets[regSlot] != 0)",
                           "funcBailOutData[index].localOffsets[regSlot] != 0");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      puVar1 = &(funcBailOutData[uVar2].bailOutRecord)->stackLiteralBailOutRecordCount;
      *puVar1 = *puVar1 + 1;
      uVar18 = bailOutInfo->stackLiteralBailOutInfoCount;
      lVar16 = lVar16 + 0x10;
    }
    pFVar13 = this->func->topFunc;
    for (lVar16 = 0; (ulong)funcCount * 0x28 - lVar16 != 0; lVar16 = lVar16 + 0x28) {
      uVar17 = (ulong)*(uint *)(*(long *)((long)&funcBailOutData->bailOutRecord + lVar16) + 0x38);
      if (uVar17 != 0) {
        pSVar15 = Memory::
                  AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<BailOutRecord::StackLiteralBailOutRecord>>,BailOutRecord::StackLiteralBailOutRecord,false>
                            ((Memory *)&pFVar13->nativeCodeDataAllocator,
                             (AllocatorNoFixup<NativeCodeData::Array<BailOutRecord::StackLiteralBailOutRecord>_>
                              *)NativeCodeData::
                                AllocatorNoFixup<NativeCodeData::Array<BailOutRecord::StackLiteralBailOutRecord>_>
                                ::Alloc,0,uVar17);
        lVar4 = *(long *)((long)&funcBailOutData->bailOutRecord + lVar16);
        *(StackLiteralBailOutRecord **)(lVar4 + 0x28) = pSVar15;
        *(undefined4 *)(lVar4 + 0x38) = 0;
      }
    }
    lVar16 = 8;
    for (uVar17 = 0; uVar17 < bailOutInfo->stackLiteralBailOutInfoCount; uVar17 = uVar17 + 1) {
      pSVar5 = bailOutInfo->stackLiteralBailOutInfo;
      pSVar3 = *(StackSym **)((long)pSVar5 + lVar16 + -8);
      uVar2 = *(uint *)((long)pSVar3->scratch + 0x78);
      uVar9 = IR::Instr::GetNumber(instr);
      if (uVar9 <= uVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7ea,
                           "(stackSym->scratch.linearScan.lifetime->start < instr->GetNumber())",
                           "stackSym->scratch.linearScan.lifetime->start < instr->GetNumber()");
        if (!bVar8) {
LAB_005355e3:
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        *puVar12 = 0;
      }
      uVar2 = *(uint *)((long)pSVar3->scratch + 0x7c);
      uVar9 = IR::Instr::GetNumber(instr);
      if (uVar2 < uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7eb,
                           "(stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber())",
                           "stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber()");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      RVar10 = StackSym::GetByteCodeRegSlot(pSVar3);
      pFVar13 = StackSym::GetByteCodeFunc(pSVar3);
      uVar2 = pFVar13->inlineDepth;
      if (RVar10 == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f1,"(regSlot != Js::Constants::NoRegister)",
                           "regSlot != Js::Constants::NoRegister");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      pJVar14 = Func::GetJITFunctionBody(pFVar13);
      RVar11 = JITTimeFunctionBody::GetLocalsCount(pJVar14);
      if (RVar11 <= RVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f2,"(regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount())"
                           ,"regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount()");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      if (funcCount <= uVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f3,"(index < funcCount)","index < funcCount");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      if (funcBailOutData[uVar2].func != pFVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f4,"(funcBailOutData[index].func == stackSymFunc)",
                           "funcBailOutData[index].func == stackSymFunc");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      if (funcBailOutData[uVar2].localOffsets[RVar10] == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f5,"(funcBailOutData[index].localOffsets[regSlot] != 0)",
                           "funcBailOutData[index].localOffsets[regSlot] != 0");
        if (!bVar8) goto LAB_005355e3;
        *puVar12 = 0;
      }
      pBVar6 = funcBailOutData[uVar2].bailOutRecord;
      pSVar15 = pBVar6->stackLiteralBailOutRecord;
      uVar2 = pBVar6->stackLiteralBailOutRecordCount;
      pBVar6->stackLiteralBailOutRecordCount = uVar2 + 1;
      pSVar15[uVar2].regSlot = RVar10;
      pSVar15[uVar2].initFldCount = *(uint *)((long)&pSVar5->stackSym + lVar16);
      lVar16 = lVar16 + 0x10;
    }
  }
  return;
}

Assistant:

void
LinearScan::FillStackLiteralBailOutRecord(IR::Instr * instr, BailOutInfo * bailOutInfo, FuncBailOutData * funcBailOutData, uint funcCount)
{
    if (bailOutInfo->stackLiteralBailOutInfoCount)
    {
        // Count the data
        ForEachStackLiteralBailOutInfo(instr, bailOutInfo, funcBailOutData, funcCount,
            [=](uint funcIndex, BailOutInfo::StackLiteralBailOutInfo& stackLiteralBailOutInfo, Js::RegSlot regSlot)
        {
            funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecordCount++;
        });

        // Allocate the data
        NativeCodeData::Allocator * allocator = this->func->GetNativeCodeDataAllocator();
        for (uint i = 0; i < funcCount; i++)
        {
            uint stackLiteralBailOutRecordCount = funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecordCount;
            if (stackLiteralBailOutRecordCount)
            {
                funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecord =
                    NativeCodeDataNewArrayNoFixup(allocator, BailOutRecord::StackLiteralBailOutRecord, stackLiteralBailOutRecordCount);
                // reset the count so we can track how much we have filled below
                funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecordCount = 0;
            }
        }

        // Fill out the data
        ForEachStackLiteralBailOutInfo(instr, bailOutInfo, funcBailOutData, funcCount,
            [=](uint funcIndex, BailOutInfo::StackLiteralBailOutInfo& stackLiteralBailOutInfo, Js::RegSlot regSlot)
        {
            uint& recordIndex = funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecordCount;
            BailOutRecord::StackLiteralBailOutRecord& stackLiteralBailOutRecord =
                funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecord[recordIndex++];
            stackLiteralBailOutRecord.regSlot = regSlot;
            stackLiteralBailOutRecord.initFldCount = stackLiteralBailOutInfo.initFldCount;
        });
    }
}